

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

word * Gia_ObjSim(Gia_Man_t *p,int Id)

{
  Vec_Wrd_t *p_00;
  int iVar1;
  word *pwVar2;
  int Id_local;
  Gia_Man_t *p_local;
  
  p_00 = p->vSims;
  iVar1 = Gia_ObjSimWords(p);
  pwVar2 = Vec_WrdEntryP(p_00,Id * iVar1);
  return pwVar2;
}

Assistant:

static inline word *       Gia_ObjSim( Gia_Man_t * p, int Id )                 { return Vec_WrdEntryP( p->vSims, Id * Gia_ObjSimWords(p) );     }